

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

void __thiscall
moira::StrWriter::briefExtension<(moira::Mode)6,(moira::Size)2>
          (StrWriter *this,Ea<(moira::Mode)6,_(moira::Size)2> *ea)

{
  StrWriter *pSVar1;
  long in_RSI;
  StrWriter *in_RDI;
  u16 disp;
  u16 scale;
  u16 lw;
  u16 reg;
  StrWriter *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  Int i;
  Scale in_stack_ffffffffffffffd4;
  Rn local_24;
  An local_20;
  Int local_1c;
  ushort local_18;
  ushort local_16;
  ushort local_14;
  ushort local_12;
  long local_10;
  
  i.raw = (i32)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  local_12 = (ushort)(*(uint *)(in_RSI + 8) >> 0xc) & 0xf;
  local_14 = (ushort)(*(uint *)(in_RSI + 8) >> 0xb) & 1;
  local_16 = (ushort)(*(uint *)(in_RSI + 8) >> 9) & 3;
  local_18 = (ushort)*(undefined4 *)(in_RSI + 8) & 0xff;
  local_10 = in_RSI;
  operator<<(in_RDI,"(");
  if (local_18 != 0) {
    Int::Int(&local_1c,(int)(char)local_18);
    pSVar1 = operator<<(in_stack_ffffffffffffffb8,i);
    operator<<(pSVar1,",");
  }
  An::An(&local_20,(uint)*(ushort *)(local_10 + 4));
  operator<<(in_RDI,local_20);
  operator<<(in_RDI,",");
  Rn::Rn(&local_24,(uint)local_12);
  operator<<(in_RDI,(Rn)in_stack_ffffffffffffffd4.raw);
  if (local_14 == 0) {
    operator<<(in_RDI);
  }
  else {
    operator<<(in_RDI);
  }
  Scale::Scale((Scale *)&stack0xffffffffffffffd4,(uint)local_16);
  pSVar1 = operator<<(in_RDI,in_stack_ffffffffffffffd4);
  operator<<(pSVar1,")");
  return;
}

Assistant:

void
StrWriter::briefExtension(const Ea<M,S> &ea)
{
    assert(M == 6 || M == 10);

    //   15 - 12    11   10   09   08   07   06   05   04   03   02   01   00
    // -----------------------------------------------------------------------
    // | REGISTER | LW | SCALE   | 0  | DISPLACEMENT                         |
    // -----------------------------------------------------------------------

    u16 reg   = xxxx____________ (ea.ext1);
    u16 lw    = ____x___________ (ea.ext1);
    u16 scale = _____xx_________ (ea.ext1);
    u16 disp  = ________xxxxxxxx (ea.ext1);

    *this << "(";
    if (disp) *this << Int{(i8)disp} << ",";
    M == 10 ? *this << "PC" : *this << An{ea.reg};
    *this << "," << Rn{reg};
    lw ? *this << Sz<Long>{} : *this << Sz<Word>{};
    *this << Scale{scale} << ")";
}